

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

CgreenVector * sorted_test_items_from(CgreenVector *test_items)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CgreenVector *pCVar4;
  long lVar5;
  undefined8 uVar6;
  char *__s1;
  
  pCVar4 = (CgreenVector *)create_cgreen_vector(destroy_test_item);
  iVar1 = cgreen_vector_size(test_items);
  while (1 < iVar1) {
    iVar1 = 0;
    lVar5 = cgreen_vector_get(test_items,0);
    __s1 = *(char **)(lVar5 + 0x10);
    iVar2 = cgreen_vector_size(test_items);
    if (1 < iVar2) {
      iVar2 = 1;
      iVar1 = 0;
      do {
        lVar5 = cgreen_vector_get(test_items,iVar2);
        iVar3 = strcmp(__s1,*(char **)(lVar5 + 0x10));
        if (0 < iVar3) {
          lVar5 = cgreen_vector_get(test_items,iVar2);
          __s1 = *(char **)(lVar5 + 0x10);
          iVar1 = iVar2;
        }
        iVar2 = iVar2 + 1;
        iVar3 = cgreen_vector_size(test_items);
      } while (iVar2 < iVar3);
    }
    cgreen_vector_remove(test_items,iVar1);
    cgreen_vector_add(pCVar4);
    iVar1 = cgreen_vector_size(test_items);
  }
  iVar1 = cgreen_vector_size(test_items);
  if (iVar1 == 1) {
    uVar6 = cgreen_vector_remove(test_items,0);
    cgreen_vector_add(pCVar4,uVar6);
    destroy_cgreen_vector(test_items);
  }
  return pCVar4;
}

Assistant:

static CgreenVector *sorted_test_items_from(CgreenVector *test_items) {
    CgreenVector *sorted = create_cgreen_vector((GenericDestructor)destroy_test_item);
    while (cgreen_vector_size(test_items) > 1) {
        int smallest = 0;
        const char *smallest_test_name = test_name_of_element(test_items, smallest);
        for (int i=1; i<cgreen_vector_size(test_items); i++) {
            const char *current_test_name = test_name_of_element(test_items, i);
            if (strcmp(smallest_test_name, current_test_name) > 0) {
                smallest = i;
                smallest_test_name = test_name_of_element(test_items, smallest);
            }
        }
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, smallest));
    }
    if (cgreen_vector_size(test_items) == 1) {
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, 0));
        destroy_cgreen_vector(test_items);
    }
    return sorted;
}